

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

VerifyDBResult __thiscall
CVerifyDB::VerifyDB(CVerifyDB *this,Chainstate *chainstate,Params *consensus_params,
                   CCoinsView *coinsview,int nCheckLevel,int nCheckDepth)

{
  long lVar1;
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  ConstevalFormatString<2U> fmt;
  ConstevalFormatString<0U> fmt_00;
  ConstevalFormatString<1U> fmt_01;
  ConstevalFormatString<1U> fmt_02;
  ConstevalFormatString<2U> fmt_03;
  ConstevalFormatString<3U> fmt_04;
  ConstevalFormatString<2U> fmt_05;
  ConstevalFormatString<2U> fmt_06;
  ConstevalFormatString<2U> fmt_07;
  ConstevalFormatString<0U> fmt_08;
  ConstevalFormatString<1U> fmt_09;
  ConstevalFormatString<2U> fmt_10;
  ConstevalFormatString<3U> fmt_11;
  ConstevalFormatString<2U> fmt_12;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  CBlockIndex *pCVar11;
  int *piVar12;
  CBlock *pCVar13;
  size_type sVar14;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  bool bVar15;
  DisconnectResult res;
  size_t curr_coins_usage;
  bool is_snapshot_cs;
  bool skipped_l3_checks;
  bool skipped_no_block_data;
  int reportDone;
  CBlockIndex *pindexFailure;
  CBlockIndex *pindex;
  int percentageDone_1;
  int block_count;
  CBlockUndo undo;
  int percentageDone;
  int nGoodTransactions;
  CBlock block_1;
  CBlock block;
  BlockValidationState state;
  CCoinsViewCache coins;
  undefined4 in_stack_fffffffffffff608;
  undefined4 uVar16;
  int in_stack_fffffffffffff60c;
  int *in_stack_fffffffffffff610;
  char *this_00;
  CChain *in_stack_fffffffffffff618;
  CCoinsViewCache *pCVar17;
  CCoinsViewCache *pCVar18;
  char *in_stack_fffffffffffff620;
  CChain *this_01;
  Chainstate *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff648;
  undefined1 in_stack_fffffffffffff64f;
  CCoinsView *in_stack_fffffffffffff650;
  undefined7 in_stack_fffffffffffff658;
  undefined1 in_stack_fffffffffffff65f;
  CBlockIndex *in_stack_fffffffffffff660;
  CBlock *in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  int *in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  CBlockUndo *in_stack_fffffffffffff690;
  BlockManager *in_stack_fffffffffffff698;
  DisconnectResult in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6bc;
  size_t in_stack_fffffffffffff6c0;
  CCoinsViewCache *in_stack_fffffffffffff6c8;
  size_t in_stack_fffffffffffff6d0;
  CCoinsViewCache *in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  CCoinsViewCache *in_stack_fffffffffffff700;
  undefined6 in_stack_fffffffffffff708;
  undefined2 uVar19;
  undefined1 fCheckPOW;
  Params *consensusParams;
  undefined4 in_stack_fffffffffffff720;
  Level LVar20;
  CBlockIndex *in_stack_fffffffffffff7b0;
  int *in_stack_fffffffffffff7c0;
  CBlockIndex *in_stack_fffffffffffff7c8;
  CBlockIndex *in_stack_fffffffffffff7d0;
  char *pcVar21;
  int local_7e4;
  CBlockIndex *local_7e0;
  CBlockIndex *local_7d8;
  VerifyDBResult local_7a4;
  undefined1 local_710 [472];
  CChain local_538 [2];
  CChain local_4f8 [3];
  undefined1 in_stack_fffffffffffffb57;
  CCoinsViewCache *in_stack_fffffffffffffb58;
  BlockValidationState *in_stack_fffffffffffffb60;
  CBlock *in_stack_fffffffffffffb68;
  Chainstate *in_stack_fffffffffffffb70;
  undefined1 local_468 [96];
  CChain local_408 [5];
  CChain local_388;
  undefined1 local_368 [128];
  CChain local_2e8 [6];
  undefined1 local_258 [560];
  CBlockIndex *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_710._400_4_ = in_R9D;
  local_710._404_4_ = in_R8D;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
             in_stack_fffffffffffff60c,(AnnotatedMixin<std::recursive_mutex> *)0x14a459b);
  pCVar11 = CChain::Tip(in_stack_fffffffffffff618);
  if ((pCVar11 == (CBlockIndex *)0x0) ||
     (pCVar11 = CChain::Tip(in_stack_fffffffffffff618), uVar16 = local_710._400_4_,
     pCVar11->pprev == (CBlockIndex *)0x0)) {
    local_7a4 = SUCCESS;
    goto LAB_014a5e30;
  }
  if (((int)local_710._400_4_ < 1) ||
     (iVar8 = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608)
                            ), iVar8 < (int)uVar16)) {
    local_710._400_4_ =
         CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  }
  local_710._396_4_ = 0;
  local_710._392_4_ = 4;
  this_01 = (CChain *)(local_710 + 0x194);
  std::min<int>(in_stack_fffffffffffff610,
                (int *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  piVar12 = std::max<int>(in_stack_fffffffffffff610,
                          (int *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
  local_710._404_4_ = *piVar12;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             in_stack_fffffffffffff620);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             in_stack_fffffffffffff620);
  pCVar17 = (CCoinsViewCache *)(local_710 + 400);
  uVar16 = 2;
  logging_function._M_str = (char *)in_stack_fffffffffffff6d8;
  logging_function._M_len = in_stack_fffffffffffff6d0;
  source_file._M_str = (char *)in_stack_fffffffffffff6c8;
  source_file._M_len = in_stack_fffffffffffff6c0;
  fmt.fmt._4_4_ = in_stack_fffffffffffff6bc;
  fmt.fmt._0_4_ = in_stack_fffffffffffff6b8;
  LogPrintFormatInternal<int,int>
            (logging_function,source_file,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Level)in_stack_fffffffffffff7b0,fmt,in_stack_fffffffffffff7c0,
             (int *)in_stack_fffffffffffff7c8);
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)CONCAT17(in_stack_fffffffffffff65f,in_stack_fffffffffffff658),
             in_stack_fffffffffffff650,(bool)in_stack_fffffffffffff64f);
  local_7e0 = (CBlockIndex *)0x0;
  local_710._356_4_ = 0;
  BlockValidationState::BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
  local_7e4 = 0;
  bVar3 = false;
  bVar2 = false;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             (char *)this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             (char *)this_01);
  this_00 = "Verification progress: 0%%\n";
  uVar16 = 2;
  logging_function_00._M_str = (char *)in_stack_fffffffffffff6d8;
  logging_function_00._M_len = in_stack_fffffffffffff6d0;
  source_file_00._M_str = (char *)in_stack_fffffffffffff6c8;
  source_file_00._M_len = in_stack_fffffffffffff6c0;
  fmt_00.fmt._4_4_ = in_stack_fffffffffffff6bc;
  fmt_00.fmt._0_4_ = in_stack_fffffffffffff6b8;
  LogPrintFormatInternal<>
            (logging_function_00,source_file_00,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
             (Level)in_stack_fffffffffffff7b0,fmt_00);
  bVar4 = std::optional::operator_cast_to_bool
                    ((optional<uint256> *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
  local_7d8 = CChain::Tip((CChain *)pCVar17);
  while( true ) {
    bVar15 = false;
    if (local_7d8 != (CBlockIndex *)0x0) {
      bVar15 = local_7d8->pprev != (CBlockIndex *)0x0;
    }
    pCVar18 = pCVar17;
    if (!bVar15) break;
    local_710._312_4_ = 1;
    local_710._308_4_ = 99;
    iVar8 = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    iVar10 = 100;
    if (3 < (int)local_710._404_4_) {
      iVar10 = 0x32;
    }
    local_710._304_4_ =
         (undefined4)
         (((double)(iVar8 - local_7d8->nHeight) / (double)(int)local_710._400_4_) * (double)iVar10);
    std::min<int>((int *)this_00,(int *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    pCVar13 = (CBlock *)
              std::max<int>((int *)this_00,(int *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    local_710._316_4_ = (pCVar13->super_CBlockHeader).nVersion;
    pCVar18 = pCVar17;
    iVar8 = local_7e4;
    if (local_7e4 < (int)local_710._316_4_ / 10) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      pCVar18 = (CCoinsViewCache *)(local_710 + 0x13c);
      this_00 = "Verification progress: %d%%\n";
      uVar16 = 2;
      logging_function_01._M_str = (char *)in_stack_fffffffffffff6d8;
      logging_function_01._M_len = in_stack_fffffffffffff6d0;
      source_file_01._M_str = (char *)in_stack_fffffffffffff6c8;
      source_file_01._M_len = in_stack_fffffffffffff6c0;
      fmt_01.fmt._4_4_ = in_stack_fffffffffffff6bc;
      fmt_01.fmt._0_4_ = in_stack_fffffffffffff6b8;
      LogPrintFormatInternal<int>
                (logging_function_01,source_file_01,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (Level)in_stack_fffffffffffff7b0,fmt_01,in_stack_fffffffffffff7c0);
      iVar8 = local_7e4;
      local_7e4 = (int)local_710._316_4_ / 10;
    }
    consensusParams = (Params *)*in_RDI;
    str.lit._7_1_ = in_stack_fffffffffffff65f;
    str.lit._0_7_ = in_stack_fffffffffffff658;
    ::_(str);
    (**(code **)(*(long *)(consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems
                + 0x20))(consensusParams,local_258,local_710._316_4_,0);
    bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    iVar10 = local_7d8->nHeight;
    iVar9 = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    uVar19 = (undefined2)iVar9;
    uVar7 = (undefined1)((uint)iVar9 >> 0x10);
    fCheckPOW = (undefined1)((uint)iVar9 >> 0x18);
    if (iVar10 <= iVar9 - local_710._400_4_) break;
    uVar5 = ::node::BlockManager::IsPruneMode
                      ((BlockManager *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    if ((((bool)uVar5) || (bVar4)) && ((local_7d8->nStatus & 8) == 0)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      pCVar18 = (CCoinsViewCache *)&local_7d8->nHeight;
      this_00 = 
      "VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n"
      ;
      uVar16 = 2;
      logging_function_02._M_str = (char *)in_stack_fffffffffffff6d8;
      logging_function_02._M_len = in_stack_fffffffffffff6d0;
      source_file_02._M_str = (char *)in_stack_fffffffffffff6c8;
      source_file_02._M_len = in_stack_fffffffffffff6c0;
      fmt_02.fmt._4_4_ = in_stack_fffffffffffff6bc;
      fmt_02.fmt._0_4_ = in_stack_fffffffffffff6b8;
      LogPrintFormatInternal<int>
                (logging_function_02,source_file_02,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (Level)in_stack_fffffffffffff7b0,fmt_02,in_stack_fffffffffffff7c0);
      bVar3 = true;
      break;
    }
    CBlock::CBlock((CBlock *)in_stack_fffffffffffff628);
    uVar6 = ::node::BlockManager::ReadBlockFromDisk
                      ((BlockManager *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670)
                       ,in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    if ((bool)uVar6) {
      pCVar17 = pCVar18;
      if (((int)local_710._404_4_ < 1) ||
         (in_stack_fffffffffffff6ff =
               CheckBlock(pCVar13,(BlockValidationState *)CONCAT44(iVar8,in_stack_fffffffffffff720),
                          consensusParams,(bool)fCheckPOW,(bool)uVar7), pCVar17 = pCVar18,
         (bool)in_stack_fffffffffffff6ff)) {
        pCVar18 = pCVar17;
        if ((1 < (int)local_710._404_4_) && (local_7d8 != (CBlockIndex *)0x0)) {
          CBlockUndo::CBlockUndo((CBlockUndo *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
          local_710._144_8_ = CBlockIndex::GetUndoPos((CBlockIndex *)this_00);
          bVar15 = FlatFilePos::IsNull((FlatFilePos *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
          if ((((bVar15 ^ 0xffU) & 1) == 0) ||
             (bVar15 = ::node::BlockManager::UndoReadFromDisk
                                 (in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                                  (CBlockIndex *)
                                  CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688)),
             bVar15)) {
            bVar15 = false;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628
                       ,(char *)this_01);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628
                       ,(char *)this_01);
            pcVar21 = "Verification error: found bad undo data at %d, hash=%s\n";
            pCVar18 = (CCoinsViewCache *)&local_7d8->nHeight;
            CBlockIndex::GetBlockHash((CBlockIndex *)pCVar17);
            pCVar17 = pCVar18;
            base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_00);
            this_00 = pcVar21;
            this_01 = &local_388;
            uVar16 = 2;
            logging_function_05._M_str = (char *)pCVar17;
            logging_function_05._M_len = in_stack_fffffffffffff6d0;
            source_file_05._M_str = (char *)in_stack_fffffffffffff6c8;
            source_file_05._M_len = in_stack_fffffffffffff6c0;
            fmt_05.fmt._4_4_ = in_stack_fffffffffffff6bc;
            fmt_05.fmt._0_4_ = in_stack_fffffffffffff6b8;
            in_stack_fffffffffffff6d8 = pCVar17;
            in_stack_fffffffffffff7c8 = (CBlockIndex *)this_00;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function_05,source_file_05,
                       (int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                       CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                       (Level)in_stack_fffffffffffff7b0,fmt_05,in_stack_fffffffffffff7c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
            ;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff60c,uVar16));
            local_7a4 = CORRUPTED_BLOCK_DB;
            bVar15 = true;
          }
          CBlockUndo::~CBlockUndo((CBlockUndo *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
          pCVar18 = pCVar17;
          if (bVar15) goto LAB_014a54a5;
        }
        in_stack_fffffffffffff6d0 = CCoinsViewCache::DynamicMemoryUsage(pCVar18);
        in_stack_fffffffffffff6c8 = Chainstate::CoinsTip(in_stack_fffffffffffff628);
        in_stack_fffffffffffff6c0 = CCoinsViewCache::DynamicMemoryUsage(pCVar18);
        in_stack_fffffffffffff7c0 = (int *)(in_stack_fffffffffffff6d0 + in_stack_fffffffffffff6c0);
        pCVar17 = pCVar18;
        if (2 < (int)local_710._404_4_) {
          if (*(int **)(in_RSI + 0xd0) < in_stack_fffffffffffff7c0) {
            bVar2 = true;
          }
          else {
            CCoinsViewCache::GetBestBlock(pCVar18);
            CBlockIndex::GetBlockHash((CBlockIndex *)pCVar18);
            bVar15 = ::operator==((base_blob<256U> *)pCVar18,(base_blob<256U> *)this_00);
            in_stack_fffffffffffff6bc = CONCAT13(bVar15,(int3)in_stack_fffffffffffff6bc);
            if (!bVar15) {
              __assert_fail("coins.GetBestBlock() == pindex->GetBlockHash()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x129a,
                            "VerifyDBResult CVerifyDB::VerifyDB(Chainstate &, const Consensus::Params &, CCoinsView &, int, int)"
                           );
            }
            in_stack_fffffffffffff6b8 =
                 Chainstate::DisconnectBlock
                           ((Chainstate *)
                            CONCAT17(fCheckPOW,CONCAT16(uVar7,CONCAT24(uVar19,iVar10))),
                            (CBlock *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffff708)),
                            (CBlockIndex *)in_stack_fffffffffffff700,
                            (CCoinsViewCache *)
                            CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8));
            if (in_stack_fffffffffffff6b8 == DISCONNECT_FAILED) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff628,(char *)this_01);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff628,(char *)this_01);
              pcVar21 = 
              "Verification error: irrecoverable inconsistency in block data at %d, hash=%s\n";
              pCVar17 = (CCoinsViewCache *)&local_7d8->nHeight;
              CBlockIndex::GetBlockHash((CBlockIndex *)pCVar18);
              base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_00);
              this_00 = pcVar21;
              this_01 = local_408;
              uVar16 = 2;
              logging_function_06._M_str = (char *)in_stack_fffffffffffff6d8;
              logging_function_06._M_len = in_stack_fffffffffffff6d0;
              source_file_06._M_str = (char *)in_stack_fffffffffffff6c8;
              source_file_06._M_len = in_stack_fffffffffffff6c0;
              fmt_06.fmt._4_4_ = in_stack_fffffffffffff6bc;
              fmt_06.fmt._0_4_ = in_stack_fffffffffffff6b8;
              in_stack_fffffffffffff7b0 = (CBlockIndex *)this_00;
              LogPrintFormatInternal<int,std::__cxx11::string>
                        (logging_function_06,source_file_06,
                         (int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                         CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                         (Level)this_00,fmt_06,in_stack_fffffffffffff7c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff7c8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff60c,uVar16));
              local_7a4 = CORRUPTED_BLOCK_DB;
              bVar15 = true;
              goto LAB_014a54a5;
            }
            if (in_stack_fffffffffffff6b8 == DISCONNECT_UNCLEAN) {
              local_710._356_4_ = 0;
              local_7e0 = local_7d8;
              pCVar17 = pCVar18;
            }
            else {
              sVar14 = std::
                       vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
              local_710._356_4_ = local_710._356_4_ + (int)sVar14;
              pCVar17 = pCVar18;
            }
          }
        }
        bVar15 = util::SignalInterrupt::operator_cast_to_bool
                           ((SignalInterrupt *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
        if (bVar15) {
          local_7a4 = INTERRUPTED;
          bVar15 = true;
        }
        else {
          bVar15 = false;
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                   (char *)this_01);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                   (char *)this_01);
        pcVar21 = "Verification error: found bad block at %d, hash=%s (%s)\n";
        pCVar17 = (CCoinsViewCache *)&local_7d8->nHeight;
        CBlockIndex::GetBlockHash((CBlockIndex *)pCVar18);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_00);
        this_00 = pcVar21;
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((ValidationState<BlockValidationResult> *)
                   CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648));
        in_stack_fffffffffffff628 = (Chainstate *)local_368;
        this_01 = (CChain *)(local_368 + 0x40);
        uVar16 = 2;
        logging_function_04._M_str = (char *)in_stack_fffffffffffff6d8;
        logging_function_04._M_len = in_stack_fffffffffffff6d0;
        source_file_04._M_str = (char *)in_stack_fffffffffffff6c8;
        source_file_04._M_len = in_stack_fffffffffffff6c0;
        fmt_04.fmt._4_4_ = in_stack_fffffffffffff6bc;
        fmt_04.fmt._0_4_ = in_stack_fffffffffffff6b8;
        in_stack_fffffffffffff7d0 = (CBlockIndex *)this_00;
        LogPrintFormatInternal<int,std::__cxx11::string,std::__cxx11::string>
                  (logging_function_04,source_file_04,
                   (int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                   CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                   (Level)in_stack_fffffffffffff7b0,fmt_04,in_stack_fffffffffffff7c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff60c,uVar16));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff60c,uVar16));
        local_7a4 = CORRUPTED_BLOCK_DB;
        bVar15 = true;
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      pCVar17 = (CCoinsViewCache *)&local_7d8->nHeight;
      CBlockIndex::GetBlockHash((CBlockIndex *)pCVar18);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_00);
      this_01 = local_2e8;
      this_00 = "Verification error: ReadBlockFromDisk failed at %d, hash=%s\n";
      uVar16 = 2;
      logging_function_03._M_str = (char *)in_stack_fffffffffffff6d8;
      logging_function_03._M_len = in_stack_fffffffffffff6d0;
      source_file_03._M_str = (char *)in_stack_fffffffffffff6c8;
      source_file_03._M_len = in_stack_fffffffffffff6c0;
      fmt_03.fmt._4_4_ = in_stack_fffffffffffff6bc;
      fmt_03.fmt._0_4_ = in_stack_fffffffffffff6b8;
      in_stack_fffffffffffff700 = pCVar17;
      LogPrintFormatInternal<int,std::__cxx11::string>
                (logging_function_03,source_file_03,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (Level)in_stack_fffffffffffff7b0,fmt_03,in_stack_fffffffffffff7c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7c8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff60c,uVar16));
      local_7a4 = CORRUPTED_BLOCK_DB;
      bVar15 = true;
    }
LAB_014a54a5:
    CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    if (bVar15) goto LAB_014a5df8;
    local_7d8 = local_7d8->pprev;
  }
  LVar20 = (Level)in_stack_fffffffffffff7b0;
  iVar8 = (int)((ulong)in_stack_fffffffffffff678 >> 0x20);
  if (local_7e0 == (CBlockIndex *)0x0) {
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      this_00 = 
      "Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n"
      ;
      uVar16 = 2;
      logging_function_08._M_str = (char *)in_stack_fffffffffffff6d8;
      logging_function_08._M_len = in_stack_fffffffffffff6d0;
      source_file_08._M_str = (char *)in_stack_fffffffffffff6c8;
      source_file_08._M_len = in_stack_fffffffffffff6c0;
      fmt_08.fmt._4_4_ = in_stack_fffffffffffff6bc;
      fmt_08.fmt._0_4_ = in_stack_fffffffffffff6b8;
      LogPrintFormatInternal<>
                (logging_function_08,source_file_08,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (Level)in_stack_fffffffffffff7b0,fmt_08);
    }
    local_710._4_4_ = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    LVar20 = (Level)in_stack_fffffffffffff7b0;
    iVar8 = (int)((ulong)in_stack_fffffffffffff678 >> 0x20);
    local_710._4_4_ = local_710._4_4_ - local_7d8->nHeight;
    if (((int)local_710._404_4_ < 4) || (bVar2)) goto LAB_014a5d06;
    goto LAB_014a56ca;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             (char *)this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             (char *)this_01);
  iVar10 = CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
  local_710._44_4_ = (iVar10 - local_7e0->nHeight) + 1;
  uVar16 = 2;
  logging_function_07._M_str = (char *)in_stack_fffffffffffff6d8;
  logging_function_07._M_len = in_stack_fffffffffffff6d0;
  source_file_07._M_str = (char *)in_stack_fffffffffffff6c8;
  source_file_07._M_len = in_stack_fffffffffffff6c0;
  fmt_07.fmt._4_4_ = in_stack_fffffffffffff6bc;
  fmt_07.fmt._0_4_ = in_stack_fffffffffffff6b8;
  LogPrintFormatInternal<int,int>
            (logging_function_07,source_file_07,iVar8,
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),LVar20,fmt_07,
             in_stack_fffffffffffff7c0,(int *)in_stack_fffffffffffff7c8);
  local_7a4 = CORRUPTED_BLOCK_DB;
  goto LAB_014a5df8;
LAB_014a5d06:
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             (char *)this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
             (char *)this_01);
  uVar16 = 2;
  logging_function_12._M_str = (char *)in_stack_fffffffffffff6d8;
  logging_function_12._M_len = in_stack_fffffffffffff6d0;
  source_file_12._M_str = (char *)in_stack_fffffffffffff6c8;
  source_file_12._M_len = in_stack_fffffffffffff6c0;
  fmt_12.fmt._4_4_ = in_stack_fffffffffffff6bc;
  fmt_12.fmt._0_4_ = in_stack_fffffffffffff6b8;
  LogPrintFormatInternal<int,int>
            (logging_function_12,source_file_12,iVar8,
             CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),LVar20,fmt_12,
             in_stack_fffffffffffff7c0,(int *)in_stack_fffffffffffff7c8);
  if (bVar2) {
    local_7a4 = SKIPPED_L3_CHECKS;
  }
  else if (bVar3) {
    local_7a4 = SKIPPED_MISSING_BLOCKS;
  }
  else {
    local_7a4 = SUCCESS;
  }
  goto LAB_014a5df8;
  while( true ) {
    CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    std::min<int>((int *)this_00,(int *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    in_stack_fffffffffffff678 =
         std::max<int>((int *)this_00,(int *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    local_710._0_4_ = *in_stack_fffffffffffff678;
    in_stack_fffffffffffff674 = local_7e4;
    if (local_7e4 < (int)local_710._0_4_ / 10) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      pCVar18 = (CCoinsViewCache *)local_710;
      this_00 = "Verification progress: %d%%\n";
      uVar16 = 2;
      logging_function_09._M_str = (char *)in_stack_fffffffffffff6d8;
      logging_function_09._M_len = in_stack_fffffffffffff6d0;
      source_file_09._M_str = (char *)in_stack_fffffffffffff6c8;
      source_file_09._M_len = in_stack_fffffffffffff6c0;
      fmt_09.fmt._4_4_ = in_stack_fffffffffffff6bc;
      fmt_09.fmt._0_4_ = in_stack_fffffffffffff6b8;
      LogPrintFormatInternal<int>
                (logging_function_09,source_file_09,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                 CONCAT44(local_7e4,in_stack_fffffffffffff670),(Level)in_stack_fffffffffffff7b0,
                 fmt_09,in_stack_fffffffffffff7c0);
      in_stack_fffffffffffff674 = local_7e4;
      local_7e4 = (int)local_710._0_4_ / 10;
    }
    pCVar13 = (CBlock *)*in_RDI;
    str_00.lit._7_1_ = in_stack_fffffffffffff65f;
    str_00.lit._0_7_ = in_stack_fffffffffffff658;
    ::_(str_00);
    (**(code **)(*(long *)&pCVar13->super_CBlockHeader + 0x20))(pCVar13,local_468,local_710._0_4_,0)
    ;
    bilingual_str::~bilingual_str((bilingual_str *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    local_7d8 = CChain::Next(this_01,(CBlockIndex *)pCVar18);
    pCVar11 = local_7d8;
    CBlock::CBlock((CBlock *)in_stack_fffffffffffff628);
    in_stack_fffffffffffff65f =
         ::node::BlockManager::ReadBlockFromDisk
                   ((BlockManager *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                    pCVar13,pCVar11);
    if ((bool)in_stack_fffffffffffff65f) {
      uVar7 = Chainstate::ConnectBlock
                        (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                         in_stack_fffffffffffffb60,in_stack_ffffffffffffffd8,
                         in_stack_fffffffffffffb58,(bool)in_stack_fffffffffffffb57);
      if ((bool)uVar7) {
        bVar4 = util::SignalInterrupt::operator_cast_to_bool
                          ((SignalInterrupt *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
        if (bVar4) {
          local_7a4 = INTERRUPTED;
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                   (char *)this_01);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                   (char *)this_01);
        pCVar17 = (CCoinsViewCache *)&local_7d8->nHeight;
        CBlockIndex::GetBlockHash((CBlockIndex *)pCVar18);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_00);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((ValidationState<BlockValidationResult> *)
                   CONCAT17(uVar7,in_stack_fffffffffffff648));
        in_stack_fffffffffffff628 = (Chainstate *)(local_710 + 0x198);
        this_01 = local_538;
        this_00 = "Verification error: found unconnectable block at %d, hash=%s (%s)\n";
        uVar16 = 2;
        logging_function_11._M_str = (char *)in_stack_fffffffffffff6d8;
        logging_function_11._M_len = in_stack_fffffffffffff6d0;
        source_file_11._M_str = (char *)in_stack_fffffffffffff6c8;
        source_file_11._M_len = in_stack_fffffffffffff6c0;
        fmt_11.fmt._4_4_ = in_stack_fffffffffffff6bc;
        fmt_11.fmt._0_4_ = in_stack_fffffffffffff6b8;
        LogPrintFormatInternal<int,std::__cxx11::string,std::__cxx11::string>
                  (logging_function_11,source_file_11,
                   (int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                   CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                   (Level)in_stack_fffffffffffff7b0,fmt_11,in_stack_fffffffffffff7c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7d0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff60c,uVar16));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff60c,uVar16));
        local_7a4 = CORRUPTED_BLOCK_DB;
        bVar4 = true;
        pCVar18 = pCVar17;
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff628,
                 (char *)this_01);
      pCVar17 = (CCoinsViewCache *)&local_7d8->nHeight;
      CBlockIndex::GetBlockHash((CBlockIndex *)pCVar18);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)this_00);
      this_01 = local_4f8;
      this_00 = "Verification error: ReadBlockFromDisk failed at %d, hash=%s\n";
      uVar16 = 2;
      logging_function_10._M_str = (char *)in_stack_fffffffffffff6d8;
      logging_function_10._M_len = in_stack_fffffffffffff6d0;
      source_file_10._M_str = (char *)in_stack_fffffffffffff6c8;
      source_file_10._M_len = in_stack_fffffffffffff6c0;
      fmt_10.fmt._4_4_ = in_stack_fffffffffffff6bc;
      fmt_10.fmt._0_4_ = in_stack_fffffffffffff6b8;
      LogPrintFormatInternal<int,std::__cxx11::string>
                (logging_function_10,source_file_10,(int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                 CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                 (Level)in_stack_fffffffffffff7b0,fmt_10,in_stack_fffffffffffff7c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7c8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff60c,uVar16));
      local_7a4 = CORRUPTED_BLOCK_DB;
      bVar4 = true;
      pCVar18 = pCVar17;
    }
    CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
    if (bVar4) break;
LAB_014a56ca:
    iVar8 = (int)((ulong)in_stack_fffffffffffff678 >> 0x20);
    pCVar11 = CChain::Tip((CChain *)pCVar18);
    LVar20 = (Level)in_stack_fffffffffffff7b0;
    if (local_7d8 == pCVar11) goto LAB_014a5d06;
  }
LAB_014a5df8:
  BlockValidationState::~BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff60c,uVar16));
LAB_014a5e30:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_7a4;
}

Assistant:

VerifyDBResult CVerifyDB::VerifyDB(
    Chainstate& chainstate,
    const Consensus::Params& consensus_params,
    CCoinsView& coinsview,
    int nCheckLevel, int nCheckDepth)
{
    AssertLockHeld(cs_main);

    if (chainstate.m_chain.Tip() == nullptr || chainstate.m_chain.Tip()->pprev == nullptr) {
        return VerifyDBResult::SUCCESS;
    }

    // Verify blocks in the best chain
    if (nCheckDepth <= 0 || nCheckDepth > chainstate.m_chain.Height()) {
        nCheckDepth = chainstate.m_chain.Height();
    }
    nCheckLevel = std::max(0, std::min(4, nCheckLevel));
    LogPrintf("Verifying last %i blocks at level %i\n", nCheckDepth, nCheckLevel);
    CCoinsViewCache coins(&coinsview);
    CBlockIndex* pindex;
    CBlockIndex* pindexFailure = nullptr;
    int nGoodTransactions = 0;
    BlockValidationState state;
    int reportDone = 0;
    bool skipped_no_block_data{false};
    bool skipped_l3_checks{false};
    LogPrintf("Verification progress: 0%%\n");

    const bool is_snapshot_cs{chainstate.m_from_snapshot_blockhash};

    for (pindex = chainstate.m_chain.Tip(); pindex && pindex->pprev; pindex = pindex->pprev) {
        const int percentageDone = std::max(1, std::min(99, (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * (nCheckLevel >= 4 ? 50 : 100))));
        if (reportDone < percentageDone / 10) {
            // report every 10% step
            LogPrintf("Verification progress: %d%%\n", percentageDone);
            reportDone = percentageDone / 10;
        }
        m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
        if (pindex->nHeight <= chainstate.m_chain.Height() - nCheckDepth) {
            break;
        }
        if ((chainstate.m_blockman.IsPruneMode() || is_snapshot_cs) && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            // If pruning or running under an assumeutxo snapshot, only go
            // back as far as we have data.
            LogPrintf("VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n", pindex->nHeight);
            skipped_no_block_data = true;
            break;
        }
        CBlock block;
        // check level 0: read from disk
        if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
            LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 1: verify block validity
        if (nCheckLevel >= 1 && !CheckBlock(block, state, consensus_params)) {
            LogPrintf("Verification error: found bad block at %d, hash=%s (%s)\n",
                      pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 2: verify undo validity
        if (nCheckLevel >= 2 && pindex) {
            CBlockUndo undo;
            if (!pindex->GetUndoPos().IsNull()) {
                if (!chainstate.m_blockman.UndoReadFromDisk(undo, *pindex)) {
                    LogPrintf("Verification error: found bad undo data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
            }
        }
        // check level 3: check for inconsistencies during memory-only disconnect of tip blocks
        size_t curr_coins_usage = coins.DynamicMemoryUsage() + chainstate.CoinsTip().DynamicMemoryUsage();

        if (nCheckLevel >= 3) {
            if (curr_coins_usage <= chainstate.m_coinstip_cache_size_bytes) {
                assert(coins.GetBestBlock() == pindex->GetBlockHash());
                DisconnectResult res = chainstate.DisconnectBlock(block, pindex, coins);
                if (res == DISCONNECT_FAILED) {
                    LogPrintf("Verification error: irrecoverable inconsistency in block data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
                if (res == DISCONNECT_UNCLEAN) {
                    nGoodTransactions = 0;
                    pindexFailure = pindex;
                } else {
                    nGoodTransactions += block.vtx.size();
                }
            } else {
                skipped_l3_checks = true;
            }
        }
        if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
    }
    if (pindexFailure) {
        LogPrintf("Verification error: coin database inconsistencies found (last %i blocks, %i good transactions before that)\n", chainstate.m_chain.Height() - pindexFailure->nHeight + 1, nGoodTransactions);
        return VerifyDBResult::CORRUPTED_BLOCK_DB;
    }
    if (skipped_l3_checks) {
        LogPrintf("Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n");
    }

    // store block count as we move pindex at check level >= 4
    int block_count = chainstate.m_chain.Height() - pindex->nHeight;

    // check level 4: try reconnecting blocks
    if (nCheckLevel >= 4 && !skipped_l3_checks) {
        while (pindex != chainstate.m_chain.Tip()) {
            const int percentageDone = std::max(1, std::min(99, 100 - (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * 50)));
            if (reportDone < percentageDone / 10) {
                // report every 10% step
                LogPrintf("Verification progress: %d%%\n", percentageDone);
                reportDone = percentageDone / 10;
            }
            m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
            pindex = chainstate.m_chain.Next(pindex);
            CBlock block;
            if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
                LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (!chainstate.ConnectBlock(block, state, pindex, coins)) {
                LogPrintf("Verification error: found unconnectable block at %d, hash=%s (%s)\n", pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
        }
    }

    LogPrintf("Verification: No coin database inconsistencies in last %i blocks (%i transactions)\n", block_count, nGoodTransactions);

    if (skipped_l3_checks) {
        return VerifyDBResult::SKIPPED_L3_CHECKS;
    }
    if (skipped_no_block_data) {
        return VerifyDBResult::SKIPPED_MISSING_BLOCKS;
    }
    return VerifyDBResult::SUCCESS;
}